

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

void add_name_to_table(compile_block_8 *cb,PCRE2_SPTR8 name,int length,uint groupno,
                      uint32_t tablecount)

{
  int iVar1;
  ulong __n;
  ushort *__src;
  
  __src = (ushort *)cb->name_table;
  __n = (ulong)(uint)length;
  if (tablecount != 0) {
    do {
      iVar1 = memcmp(name,__src + 1,__n);
      if (iVar1 == 0) {
        if (*(char *)((long)__src + __n + 2) != '\0') goto LAB_0018a26f;
      }
      else if (iVar1 < 0) {
LAB_0018a26f:
        memmove((void *)((ulong)cb->name_entry_size + (long)__src),__src,
                (ulong)(tablecount * cb->name_entry_size));
        break;
      }
      __src = (ushort *)((long)__src + (ulong)cb->name_entry_size);
      tablecount = tablecount - 1;
    } while (tablecount != 0);
  }
  *__src = (ushort)groupno << 8 | (ushort)groupno >> 8;
  memcpy(__src + 1,name,__n);
  memset((void *)((long)__src + __n + 2),0,(long)(int)(((uint)cb->name_entry_size - length) + -2));
  return;
}

Assistant:

static void
add_name_to_table(compile_block *cb, PCRE2_SPTR name, int length,
  unsigned int groupno, uint32_t tablecount)
{
uint32_t i;
PCRE2_UCHAR *slot = cb->name_table;

for (i = 0; i < tablecount; i++)
  {
  int crc = memcmp(name, slot+IMM2_SIZE, CU2BYTES(length));
  if (crc == 0 && slot[IMM2_SIZE+length] != 0)
    crc = -1; /* Current name is a substring */

  /* Make space in the table and break the loop for an earlier name. For a
  duplicate or later name, carry on. We do this for duplicates so that in the
  simple case (when ?(| is not used) they are in order of their numbers. In all
  cases they are in the order in which they appear in the pattern. */

  if (crc < 0)
    {
    (void)memmove(slot + cb->name_entry_size, slot,
      CU2BYTES((tablecount - i) * cb->name_entry_size));
    break;
    }

  /* Continue the loop for a later or duplicate name */

  slot += cb->name_entry_size;
  }

PUT2(slot, 0, groupno);
memcpy(slot + IMM2_SIZE, name, CU2BYTES(length));

/* Add a terminating zero and fill the rest of the slot with zeroes so that
the memory is all initialized. Otherwise valgrind moans about uninitialized
memory when saving serialized compiled patterns. */

memset(slot + IMM2_SIZE + length, 0,
  CU2BYTES(cb->name_entry_size - length - IMM2_SIZE));
}